

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_uint32 ma_pcm_rb_get_subbuffer_offset(ma_pcm_rb *pRB,ma_uint32 subbufferIndex)

{
  int iVar1;
  ma_uint32 mVar2;
  size_t sVar3;
  undefined4 in_ESI;
  long in_RDI;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_14;
  
  if (in_RDI == 0) {
    local_14 = 0;
  }
  else {
    sVar3 = ma_rb_get_subbuffer_offset
                      ((ma_rb *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0
                      );
    iVar1 = *(int *)(in_RDI + 0x8c);
    mVar2 = ma_get_bytes_per_sample(*(ma_format *)(in_RDI + 0x88));
    local_14 = (ma_uint32)(sVar3 / (mVar2 * iVar1));
  }
  return local_14;
}

Assistant:

MA_API ma_uint32 ma_pcm_rb_get_subbuffer_offset(ma_pcm_rb* pRB, ma_uint32 subbufferIndex)
{
    if (pRB == NULL) {
        return 0;
    }

    return (ma_uint32)(ma_rb_get_subbuffer_offset(&pRB->rb, subbufferIndex) / ma_pcm_rb_get_bpf(pRB));
}